

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineWriter.cpp
# Opt level: O2

InlineReader * __thiscall adios2::core::engine::InlineWriter::GetReader(InlineWriter *this)

{
  IO *pIVar1;
  ulong uVar2;
  Mode MVar3;
  long lVar4;
  InlineReader *pIVar5;
  allocator local_a4;
  allocator local_a3;
  allocator local_a2;
  allocator local_a1;
  shared_ptr<adios2::core::Engine> e;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  pIVar1 = (this->super_Engine).m_IO;
  uVar2 = (pIVar1->m_Engines)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (uVar2 != 1) {
    if (2 < uVar2) {
      std::__cxx11::string::string((string *)&local_30,"Engine",(allocator *)&e);
      std::__cxx11::string::string((string *)&local_50,"InlineWriter",&local_a2);
      std::__cxx11::string::string((string *)&local_70,"GetReader",&local_a3);
      std::__cxx11::string::string
                ((string *)&local_90,
                 "There must be only one inline writer and at most one inline reader.",&local_a4);
      helper::Throw<std::runtime_error>(&local_30,&local_50,&local_70,&local_90,-1);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
    }
    std::__shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&e.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2> *)
               ((pIVar1->m_Engines)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 2));
    MVar3 = Engine::OpenMode(e.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr);
    if (MVar3 == Write) {
      lVar4 = std::_Rb_tree_decrement
                        (&(pIVar1->m_Engines)._M_t._M_impl.super__Rb_tree_header._M_header);
      std::__shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&e.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2> *)(lVar4 + 0x40));
    }
    if ((e.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
         (element_type *)0x0) ||
       (pIVar5 = (InlineReader *)
                 __dynamic_cast(e.
                                super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr,&Engine::typeinfo,&InlineReader::typeinfo,0),
       pIVar5 == (InlineReader *)0x0)) {
      std::__cxx11::string::string((string *)&local_30,"Engine",&local_a2);
      std::__cxx11::string::string((string *)&local_50,"InlineWriter",&local_a3);
      std::__cxx11::string::string((string *)&local_70,"GetReader",&local_a4);
      std::__cxx11::string::string
                ((string *)&local_90,
                 "dynamic_cast<InlineReader*> failed; this is very likely a bug.",&local_a1);
      helper::Throw<std::runtime_error>(&local_30,&local_50,&local_70,&local_90,-1);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      pIVar5 = (InlineReader *)0x0;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&e.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    return pIVar5;
  }
  return (InlineReader *)0x0;
}

Assistant:

const InlineReader *InlineWriter::GetReader() const
{
    const auto &engine_map = m_IO.GetEngines();
    if (engine_map.size() == 1)
    {
        // it should be fine for a writer to be created and start running,
        // without the reader having been created. This is necessary to run
        // correctly with ParaView Catalyst Live.
        return nullptr;
    }
    else if (engine_map.size() > 2)
    {
        helper::Throw<std::runtime_error>("Engine", "InlineWriter", "GetReader",
                                          "There must be only one inline writer and at most "
                                          "one inline reader.");
    }

    std::shared_ptr<Engine> e = engine_map.begin()->second;
    if (e->OpenMode() == adios2::Mode::Write)
    {
        e = engine_map.rbegin()->second;
    }

    const auto reader = dynamic_cast<InlineReader *>(e.get());
    if (!reader)
    {
        helper::Throw<std::runtime_error>(
            "Engine", "InlineWriter", "GetReader",
            "dynamic_cast<InlineReader*> failed; this is very likely a bug.");
    }
    return reader;
}